

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O1

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionCall *call)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _Alloc_hider _Var2;
  _Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false> _Var3;
  pointer puVar4;
  __uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  _Var5;
  FunctionCallArgument *pFVar6;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> _Var7;
  _Hash_node_base *p_Var8;
  undefined1 auVar9 [16];
  char *pcVar10;
  _Head_base<0UL,_ninx::parser::util::LateCallDescriptor_*,_false> _Var11;
  bool bVar12;
  int iVar13;
  string *psVar14;
  Block *pBVar15;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *pvVar16;
  vector<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
  *pvVar17;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar18;
  undefined8 extraout_RAX;
  undefined8 uVar19;
  undefined8 extraout_RAX_00;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *puVar20;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *pvVar21;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar22;
  LateCallDescriptor *this_00;
  RuntimeException *pRVar23;
  RuntimeException *pRVar24;
  long *plVar25;
  undefined8 *puVar26;
  size_type *psVar27;
  char (*Separator) [3];
  pointer *__ptr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  pointer *__ptr_1;
  long lVar29;
  long lVar30;
  FunctionCall *this_01;
  ulong uVar31;
  undefined1 auVar32 [16];
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_> body;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> argument_name;
  type joined_missing;
  string field_name;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  call_mandatory_arguments;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char *local_188;
  undefined8 local_180;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_178;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_170;
  string local_168;
  string local_148;
  DefaultEvaluator *local_128;
  _Head_base<0UL,_ninx::parser::util::LateCallDescriptor_*,_false> local_120;
  __node_base local_118;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_110;
  Block *local_108;
  FunctionCall *local_100;
  ulong local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined4 local_90;
  undefined8 local_88;
  __node_base_ptr p_Stack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var;
  
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  local_148._M_string_length = 0;
  local_148.field_2._M_local_buf[0] = '\0';
  pBVar15 = (call->super_Statement).super_ASTElement.parent;
  local_128 = this;
  psVar14 = parser::element::FunctionCall::get_name_abi_cxx11_(call);
  local_108 = navigate_object_tree(pBVar15,psVar14,&local_148);
  pBVar15 = (Block *)parser::element::Block::get_function(local_108,&local_148);
  if (pBVar15 == (Block *)0x0) {
    pBVar15 = (Block *)parser::element::Block::get_builtin(local_108,&local_148);
    if (pBVar15 == (Block *)0x0) {
      pRVar24 = (RuntimeException *)__cxa_allocate_exception(0x38);
      local_b0._M_allocated_capacity = (size_type)&local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TODO","");
      psVar14 = parser::element::FunctionCall::get_name_abi_cxx11_(call);
      std::operator+(&local_168,"Function \"",psVar14);
      plVar25 = (long *)std::__cxx11::string::append((char *)&local_168);
      local_1a8._M_allocated_capacity = *plVar25;
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar25 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity == paVar28) {
        local_198._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_198._8_8_ = plVar25[3];
        local_1a8._M_allocated_capacity = (size_type)&local_198;
      }
      else {
        local_198._M_allocated_capacity = paVar28->_M_allocated_capacity;
      }
      local_1a8._8_8_ = plVar25[1];
      *plVar25 = (long)paVar28;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      exception::RuntimeException::RuntimeException
                (pRVar24,0,(string *)&local_b0,(string *)(local_1b8 + 0x10));
      __cxa_throw(pRVar24,&exception::RuntimeException::typeinfo,
                  exception::RuntimeException::~RuntimeException);
    }
  }
  parser::element::FunctionDefinition::get_body((FunctionDefinition *)pBVar15);
  parser::element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)local_1b8);
  (**(code **)(*(size_type *)local_1b8._0_8_ + 0x28))
            (local_1b8._0_8_,(call->super_Statement).super_ASTElement.__output_block);
  iVar13 = parser::element::FunctionCall::get_argument_count(call);
  pvVar16 = parser::element::FunctionDefinition::get_arguments((FunctionDefinition *)pBVar15);
  if ((ulong)((long)(pvVar16->
                    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar16->
                    super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) < (ulong)(long)iVar13) {
    pRVar24 = (RuntimeException *)__cxa_allocate_exception(0x38);
    local_b0._M_allocated_capacity = (size_type)&local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TODO","");
    psVar14 = parser::element::FunctionCall::get_name_abi_cxx11_(call);
    std::operator+(&local_168,"Function \"",psVar14);
    plVar25 = (long *)std::__cxx11::string::append((char *)&local_168);
    local_1a8._M_allocated_capacity = *plVar25;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar25 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_allocated_capacity == paVar28) {
      local_198._M_allocated_capacity = paVar28->_M_allocated_capacity;
      local_198._8_8_ = plVar25[3];
      local_1a8._M_allocated_capacity = (size_type)&local_198;
    }
    else {
      local_198._M_allocated_capacity = paVar28->_M_allocated_capacity;
    }
    local_1a8._8_8_ = plVar25[1];
    *plVar25 = (long)paVar28;
    plVar25[1] = 0;
    *(undefined1 *)(plVar25 + 2) = 0;
    exception::RuntimeException::RuntimeException
              (pRVar24,0,(string *)&local_b0,(string *)(local_1b8 + 0x10));
    __cxa_throw(pRVar24,&exception::RuntimeException::typeinfo,
                exception::RuntimeException::~RuntimeException);
  }
  local_b0._M_allocated_capacity = (size_type)&p_Stack_80;
  local_b0._8_8_ = 1;
  local_a0._M_allocated_capacity = 0;
  local_a0._8_8_ = 0;
  local_90 = 0x3f800000;
  local_88 = 0;
  p_Stack_80 = (__node_base_ptr)0x0;
  local_1b8._8_8_ = pBVar15;
  local_100 = call;
  pvVar17 = parser::element::FunctionCall::get_arguments(call);
  pRVar24 = (RuntimeException *)
            (pvVar17->
            super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pRVar23 = (RuntimeException *)
            (pvVar17->
            super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar24 != pRVar23) {
    lVar30 = 0;
    uVar31 = 0;
    local_f8 = 0;
    do {
      paVar28 = &local_198;
      puVar18 = parser::element::FunctionCallArgument::get_name_abi_cxx11_
                          (((__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
                             *)&pRVar24->super_runtime_error)[uVar31].
                           super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                           .
                           super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                           ._M_head_impl);
      if ((puVar18->_M_t).
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        if ((local_f8 & 1) != 0) {
LAB_00130c34:
          pRVar24 = (RuntimeException *)__cxa_allocate_exception(0x38);
          local_1a8._M_allocated_capacity = (size_type)paVar28;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1b8 + 0x10),"TODO","");
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"Cannot use ordinals arguments after a named argument","")
          ;
          exception::RuntimeException::RuntimeException
                    (pRVar24,0,(string *)(local_1b8 + 0x10),&local_168);
          __cxa_throw(pRVar24,&exception::RuntimeException::typeinfo,
                      exception::RuntimeException::~RuntimeException);
        }
        pvVar16 = parser::element::FunctionDefinition::get_arguments
                            ((FunctionDefinition *)local_1b8._8_8_);
        paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1b8 + 0x10);
        puVar4 = (pvVar16->
                 super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(pvVar16->
                          super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <= uVar31
           ) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar31);
          goto LAB_00130c34;
        }
        _Var5._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
        .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl =
             puVar4[uVar31]._M_t.
             super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ._M_t;
        psVar14 = parser::element::FunctionArgument::get_name_abi_cxx11_
                            ((FunctionArgument *)
                             _Var5._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                             .
                             super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>
                             ._M_head_impl);
        bVar12 = parser::element::FunctionDefinition::check_mandatory
                           ((FunctionDefinition *)local_1b8._8_8_,psVar14);
        if (bVar12) {
          psVar14 = parser::element::FunctionArgument::get_name_abi_cxx11_
                              ((FunctionArgument *)
                               _Var5._M_t.
                               super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                               .
                               super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>
                               ._M_head_impl);
          local_1a8._M_allocated_capacity = (size_type)&local_b0;
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_1a8._M_allocated_capacity,psVar14,paVar28);
        }
        if (current_return_block != (Block *)0x0) {
          (*(current_return_block->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        current_return_block = (Block *)0x0;
        _Var3._M_head_impl =
             ((__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
               *)&pRVar24->super_runtime_error)[uVar31].
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ASTElement + 0x10))
                  (_Var3._M_head_impl,local_128);
        uVar19 = local_1b8._0_8_;
        pBVar15 = current_return_block;
        current_return_block = (Block *)0x0;
        local_58 = lVar30;
        psVar14 = parser::element::FunctionArgument::get_name_abi_cxx11_
                            ((FunctionArgument *)
                             _Var5._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                             .
                             super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>
                             ._M_head_impl);
        local_178._M_head_impl = pBVar15;
        parser::element::Block::set_variable
                  ((Block *)uVar19,psVar14,
                   (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                    *)&local_178,true);
        if (local_178._M_head_impl != (Block *)0x0) {
          (*((local_178._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        local_178._M_head_impl = (Block *)0x0;
        lVar29 = local_58;
      }
      else {
        puVar18 = parser::element::FunctionCallArgument::get_name_abi_cxx11_
                            (((__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
                               *)&pRVar24->super_runtime_error)[uVar31].
                             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                             .
                             super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                             ._M_head_impl);
        pbVar1 = (puVar18->_M_t).
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
        _Var2._M_p = (pbVar1->_M_dataplus)._M_p;
        local_1a8._M_allocated_capacity = (size_type)paVar28;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_1b8 + 0x10),_Var2._M_p,_Var2._M_p + pbVar1->_M_string_length);
        bVar12 = parser::element::FunctionDefinition::check_argument
                           ((FunctionDefinition *)local_1b8._8_8_,(string *)(local_1b8 + 0x10));
        if (!bVar12) {
          pRVar23 = (RuntimeException *)__cxa_allocate_exception(0x38);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"TODO","");
          puVar18 = parser::element::FunctionCallArgument::get_name_abi_cxx11_
                              (((__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
                                 *)&pRVar24->super_runtime_error)[uVar31].
                               super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
                               .
                               super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>
                               ._M_head_impl);
          std::operator+(&local_50,"Argument \"",
                         (puVar18->_M_t).
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
          plVar25 = (long *)std::__cxx11::string::append((char *)&local_50);
          auVar9._8_8_ = &local_f0.field_2;
          auVar9._0_8_ = plVar25;
          auVar32._8_8_ = (size_type *)*plVar25;
          auVar32._0_8_ = plVar25;
          psVar27 = (size_type *)(plVar25 + 2);
          if ((size_type *)*plVar25 != psVar27) goto LAB_00130e40;
          local_f0.field_2._M_allocated_capacity = *psVar27;
          local_f0.field_2._8_8_ = plVar25[3];
          goto LAB_00130e53;
        }
        bVar12 = parser::element::FunctionDefinition::check_mandatory
                           ((FunctionDefinition *)local_1b8._8_8_,(string *)(local_1b8 + 0x10));
        if (bVar12) {
          local_168._M_dataplus._M_p = (pointer)&local_b0;
          std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_168._M_dataplus._M_p,local_1b8 + 0x10,&local_168);
        }
        if (current_return_block != (Block *)0x0) {
          (*(current_return_block->super_Expression).super_Statement.super_ASTElement.
            _vptr_ASTElement[1])();
        }
        current_return_block = (Block *)0x0;
        _Var3._M_head_impl =
             ((__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
               *)&pRVar24->super_runtime_error)[uVar31].
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
        (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ASTElement + 0x10))
                  (_Var3._M_head_impl,local_128);
        local_170._M_head_impl = current_return_block;
        current_return_block = (Block *)0x0;
        parser::element::Block::set_variable
                  ((Block *)local_1b8._0_8_,(string *)(local_1b8 + 0x10),
                   (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                    *)&local_170,true);
        uVar19 = extraout_RAX;
        if (local_170._M_head_impl != (Block *)0x0) {
          iVar13 = (*((local_170._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
                     _vptr_ASTElement[1])();
          uVar19 = CONCAT44(extraout_var,iVar13);
        }
        local_170._M_head_impl = (Block *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_allocated_capacity != paVar28) {
          operator_delete((void *)local_1a8._M_allocated_capacity,
                          local_198._M_allocated_capacity + 1);
          uVar19 = extraout_RAX_00;
        }
        local_f8 = CONCAT71((int7)((ulong)uVar19 >> 8),1);
        lVar29 = lVar30;
      }
      uVar31 = uVar31 + 1;
      lVar30 = lVar29 + 8;
    } while ((RuntimeException *)(&pRVar24->field_0x8 + lVar29) != pRVar23);
  }
  this_01 = local_100;
  puVar20 = parser::element::FunctionCall::get_outer_argument(local_100);
  uVar19 = local_1b8._8_8_;
  pBVar15 = (Block *)local_1b8._8_8_;
  if ((puVar20->_M_t).
      super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      ._M_t.
      super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
      .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>._M_head_impl !=
      (FunctionCallArgument *)0x0) {
    pvVar16 = parser::element::FunctionDefinition::get_arguments
                        ((FunctionDefinition *)local_1b8._8_8_);
    pvVar21 = parser::element::FunctionDefinition::get_arguments((FunctionDefinition *)uVar19);
    psVar27 = (size_type *)
              ((long)(pvVar21->
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar21->
                     super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3);
    puVar4 = (pvVar16->
             super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar16->
                      super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <=
        (long)psVar27 - 1U) {
      auVar32 = std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
      pRVar23 = pRVar24;
LAB_00130e40:
      local_f0.field_2._M_allocated_capacity = *psVar27;
      auVar9 = auVar32;
LAB_00130e53:
      local_f0._M_dataplus._M_p = auVar9._8_8_;
      puVar26 = auVar9._0_8_;
      local_f0._M_string_length = puVar26[1];
      *puVar26 = psVar27;
      puVar26[1] = 0;
      *(undefined1 *)(puVar26 + 2) = 0;
      psVar14 = parser::element::FunctionCall::get_name_abi_cxx11_(local_100);
      std::operator+(&local_78,&local_f0,psVar14);
      plVar25 = (long *)std::__cxx11::string::append((char *)&local_78);
      local_d0._M_allocated_capacity = *plVar25;
      paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar25 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_allocated_capacity == paVar28) {
        local_c0._M_allocated_capacity = paVar28->_M_allocated_capacity;
        local_c0._8_8_ = plVar25[3];
        local_d0._M_allocated_capacity = (size_type)&local_c0;
      }
      else {
        local_c0._M_allocated_capacity = paVar28->_M_allocated_capacity;
      }
      local_d0._8_8_ = plVar25[1];
      *plVar25 = (long)paVar28;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      exception::RuntimeException::RuntimeException(pRVar23,0,&local_168,(string *)&local_d0);
      __cxa_throw(pRVar23,&exception::RuntimeException::typeinfo,
                  exception::RuntimeException::~RuntimeException);
    }
    _Var5._M_t.
    super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
    .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl =
         puVar4[(long)psVar27 + -1]._M_t.
         super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
         ._M_t;
    psVar14 = parser::element::FunctionArgument::get_name_abi_cxx11_
                        ((FunctionArgument *)
                         _Var5._M_t.
                         super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                         .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                         _M_head_impl);
    bVar12 = parser::element::FunctionDefinition::check_mandatory
                       ((FunctionDefinition *)uVar19,psVar14);
    if (bVar12) {
      psVar14 = parser::element::FunctionArgument::get_name_abi_cxx11_
                          ((FunctionArgument *)
                           _Var5._M_t.
                           super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                           .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                           _M_head_impl);
      local_1a8._M_allocated_capacity = (size_type)&local_b0;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_1a8._M_allocated_capacity,psVar14);
    }
    if (current_return_block != (Block *)0x0) {
      (*(current_return_block->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement
        [1])();
    }
    current_return_block = (Block *)0x0;
    puVar20 = parser::element::FunctionCall::get_outer_argument(this_01);
    pFVar6 = (puVar20->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
    (**(code **)((long)(pFVar6->super_ASTElement)._vptr_ASTElement + 0x10))(pFVar6,local_128);
    uVar19 = local_1b8._0_8_;
    pBVar15 = current_return_block;
    current_return_block = (Block *)0x0;
    psVar14 = parser::element::FunctionArgument::get_name_abi_cxx11_
                        ((FunctionArgument *)
                         _Var5._M_t.
                         super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                         .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                         _M_head_impl);
    local_110._M_head_impl = pBVar15;
    parser::element::Block::set_variable
              ((Block *)uVar19,psVar14,
               (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                *)&local_110,true);
    this_01 = local_100;
    pBVar15 = (Block *)local_1b8._8_8_;
    if (local_110._M_head_impl != (Block *)0x0) {
      (*((local_110._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
        _vptr_ASTElement[1])();
    }
    local_110._M_head_impl = (Block *)0x0;
  }
  uVar19 = local_a0._8_8_;
  puVar22 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_
                      ((FunctionDefinition *)pBVar15);
  if (uVar19 == (puVar22->_M_h)._M_element_count) {
    bVar12 = parser::element::FunctionCall::is_late_call(this_01);
    if (bVar12) {
      this_00 = (LateCallDescriptor *)operator_new(0x18);
      local_1a8._M_allocated_capacity = local_1b8._0_8_;
      local_1b8._0_8_ = (_func_int **)0x0;
      parser::util::LateCallDescriptor::LateCallDescriptor
                (this_00,(unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                          *)(local_1b8 + 0x10),(FunctionDefinition *)pBVar15,local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_1a8._M_allocated_capacity + 8))();
      }
      local_120._M_head_impl = this_00;
      parser::element::Block::__add_late_call
                ((this_01->super_Statement).super_ASTElement.parent,
                 (unique_ptr<ninx::parser::util::LateCallDescriptor,_std::default_delete<ninx::parser::util::LateCallDescriptor>_>
                  *)&local_120);
      _Var11._M_head_impl = local_120._M_head_impl;
      if (local_120._M_head_impl != (LateCallDescriptor *)0x0) {
        _Var7._M_head_impl =
             ((local_120._M_head_impl)->body)._M_t.
             super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
             .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
        if (_Var7._M_head_impl != (Block *)0x0) {
          (**(code **)(*(long *)&(_Var7._M_head_impl)->super_Expression + 8))();
        }
        ((_Var11._M_head_impl)->body)._M_t.
        super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
        .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl = (Block *)0x0;
        operator_delete(_Var11._M_head_impl,0x18);
      }
      local_120._M_head_impl = (LateCallDescriptor *)0x0;
    }
    else {
      local_118._M_nxt = (_Hash_node_base *)local_1b8._0_8_;
      local_1b8._0_8_ = (_func_int **)0x0;
      evaluate_function(local_128,local_108,(FunctionDefinition *)pBVar15,
                        (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                         *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_nxt !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(local_118._M_nxt)->_M_nxt)->_M_allocated_capacity + 8))();
      }
      local_118._M_nxt = (_Hash_node_base *)0x0;
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_b0);
    if ((_func_int **)local_1b8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_1b8._0_8_ + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      CONCAT71(local_148.field_2._M_allocated_capacity._1_7_,
                               local_148.field_2._M_local_buf[0]) + 1);
    }
    return;
  }
  pcVar10 = local_1a8._M_local_buf + 8;
  local_1a8._8_8_ = (ulong)(uint)local_1a8._12_4_ << 0x20;
  local_198._M_allocated_capacity = 0;
  local_180 = 0;
  local_198._8_8_ = pcVar10;
  local_188 = pcVar10;
  puVar22 = parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_
                      ((FunctionDefinition *)pBVar15);
  p_Var8 = (puVar22->_M_h)._M_before_begin._M_nxt;
  parser::element::FunctionDefinition::get_mandatory_arguments_abi_cxx11_
            ((FunctionDefinition *)local_1b8._8_8_);
  Separator = (char (*) [3])0x0;
  std::
  __set_difference<std::__detail::_Node_const_iterator<std::__cxx11::string,true,true>,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (p_Var8,0,local_a0._M_allocated_capacity,0,local_1b8 + 0x10,pcVar10);
  boost::algorithm::
  join<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,char[3]>
            (&local_168,(algorithm *)(local_1b8 + 0x10),
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)", ",Separator);
  pRVar24 = (RuntimeException *)__cxa_allocate_exception(0x38);
  local_d0._M_allocated_capacity = (size_type)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"TODO","");
  std::operator+(&local_f0,"Missing required arguments: \"",&local_168);
  plVar25 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_78._M_dataplus._M_p = (pointer)*plVar25;
  paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar25 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar28) {
    local_78.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
    local_78.field_2._8_8_ = plVar25[3];
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar28->_M_allocated_capacity;
  }
  local_78._M_string_length = plVar25[1];
  *plVar25 = (long)paVar28;
  plVar25[1] = 0;
  *(undefined1 *)(plVar25 + 2) = 0;
  exception::RuntimeException::RuntimeException(pRVar24,0,(string *)&local_d0,&local_78);
  __cxa_throw(pRVar24,&exception::RuntimeException::typeinfo,
              exception::RuntimeException::~RuntimeException);
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionCall *call) {
    // Obtain the referenced object by navigating the name structure
    std::string field_name;
    auto target_object { navigate_object_tree(call->get_parent(), call->get_name(), field_name) };

    // Get the target function
    auto function {target_object->get_function(field_name)};

    if (!function) {
        // The function is not defined, check if it is a builtin one.
        auto builtin{target_object->get_builtin(field_name)};

        if (builtin) { // Builtin function exist.
            function = builtin;
        } else {  // Not a builtin either
            // TODO: add information of line number and origin
            throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Function \"" + call->get_name() +
                                                                          "\" has not been declared!");
        }
    }

    // Clone the function definition body, to generate a new instance
    auto body {function->get_body()->clone<ninx::parser::element::Block>()};

    body->__set_output_block(call->__get_output_block());

    // Load all the call arguments

    // Check if the call arguments are too many
    if (call->get_argument_count() > function->get_arguments().size()) {
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Function \""+call->get_name()+"\" is called with too many parameters!");
    }

    // Check if the named call arguments are present in the function definition and make sure that
    // after a named parameter, no ordinal parameters can be used.
    // Then populate the call arguments as function body block local variables
    bool named_started {false};
    int index {0};  // Current ordinal parameter index

    std::unordered_set<std::string> call_mandatory_arguments;

    for (auto &argument : call->get_arguments()) {
        if (argument->get_name()) {
            auto argument_name {*(argument->get_name())};
            named_started = true;

            if (!function->check_argument(argument_name)){
                // TODO: add information of line number and origin
                throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Argument \"" + *(argument->get_name()) +
                                                                              "\" is not a valid for function \""+call->get_name()+"\"");
            }

            if (function->check_mandatory(argument_name)) {
                call_mandatory_arguments.insert(argument_name);
            }

            // Evaluate the argument value and get the result
            reset_return_block();
            argument->accept(this);
            auto result_value {get_owned_return_block()};

            // Setup the argument as a local variable
            body->set_variable(argument_name, std::move(result_value), true);
        }else{
            // Check if an ordinal parameter has been used after a named parameter
            if (named_started) {
                // TODO: add information of line number and origin
                throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Cannot use ordinals arguments after a named argument");
            }

            auto definition_argument {function->get_arguments().at(static_cast<unsigned long long int>(index)).get()};

            if (function->check_mandatory(definition_argument->get_name())) {
                call_mandatory_arguments.insert(definition_argument->get_name());
            }

            // Evaluate the argument value and get the result
            reset_return_block();
            argument->accept(this);
            auto result_value {get_owned_return_block()};

            // Setup the argument as a local variable
            body->set_variable(definition_argument->get_name(), std::move(result_value), true);
        }
        index++;
    }

    // Add also the outer_argument
    if (call->get_outer_argument()) {
        auto last_definition_argument {function->get_arguments().at(function->get_arguments().size()-1).get()};

        if (function->check_mandatory(last_definition_argument->get_name())) {
            call_mandatory_arguments.insert(last_definition_argument->get_name());
        }

        // Evaluate the argument value and get the result
        reset_return_block();
        call->get_outer_argument()->accept(this);
        auto result_value {get_owned_return_block()};

        // Setup the argument as a local variable
        body->set_variable(last_definition_argument->get_name(), std::move(result_value), true);
    }

    // Check if all mandatory arguments are been used
    if (call_mandatory_arguments.size() != function->get_mandatory_arguments().size()) {
        std::set<std::string> missing;

        // Find the missing parameters by calculating the difference between the definition and the call
        std::set_difference(function->get_mandatory_arguments().begin(), function->get_mandatory_arguments().end(),
                            call_mandatory_arguments.begin(), call_mandatory_arguments.end(),
                            std::inserter(missing, missing.end()));

        auto joined_missing {boost::algorithm::join(missing, ", ")};
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Missing required arguments: \""+joined_missing+"\"");
    }

    if (!call->is_late_call()) {  // Not a late call, evaluate immediately
        evaluate_function(target_object, function, std::move(body));
    }else{  // Late call, register it to be called later.
        // Create the late call descriptor
        auto descriptor = std::make_unique<ninx::parser::util::LateCallDescriptor>(std::move(body), function, target_object);
        call->get_parent()->__add_late_call(std::move(descriptor));
    }
}